

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_dalloc_bin_locked_impl
               (tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind,extent_t *slab,void *ptr,
               _Bool junked)

{
  size_t *psVar1;
  uint64_t *puVar2;
  ulong *puVar3;
  extent_t *peVar4;
  uint uVar5;
  ulong uVar6;
  extent_t *peVar7;
  bin_t *bin_00;
  ulong uVar8;
  ulong uVar9;
  
  if ((!junked) && (opt_junk_free)) {
    memset(ptr,0x5a,bin_infos[binind].reg_size);
  }
  uVar6 = slab->e_bits;
  uVar8 = uVar6 >> 0x12 & 0xff;
  uVar9 = (ulong)arena_binind_div_info[uVar8].magic * ((long)ptr - (long)slab->e_addr);
  puVar3 = (ulong *)((long)&slab->field_5 + (uVar9 >> 0x26) * 8);
  *puVar3 = *puVar3 ^ 1L << ((byte)(uVar9 >> 0x20) & 0x3f);
  uVar6 = uVar6 + 0x4000000;
  slab->e_bits = uVar6;
  uVar5 = (uint)(uVar6 >> 0x1a) & 0x3ff;
  if (uVar5 == bin_infos[binind].nregs) {
    if (bin->slabcur == slab) {
      bin->slabcur = (extent_t *)0x0;
    }
    else if (bin_infos[uVar8].nregs == 1) {
      if (manual_arena_base <= arena->base->ind) {
        peVar7 = (bin->slabs_full).qlh_first;
        if (peVar7 == slab) {
          peVar7 = (peVar7->ql_link).qre_next;
          (bin->slabs_full).qlh_first = peVar7;
        }
        if (peVar7 == slab) {
          (bin->slabs_full).qlh_first = (extent_t *)0x0;
        }
        else {
          peVar7 = (slab->ql_link).qre_next;
          peVar4 = (slab->ql_link).qre_prev;
          (peVar4->ql_link).qre_next = peVar7;
          (peVar7->ql_link).qre_prev = peVar4;
          (slab->ql_link).qre_next = slab;
          (slab->ql_link).qre_prev = slab;
        }
      }
    }
    else {
      extent_heap_remove(&bin->slabs_nonfull,slab);
      psVar1 = &(bin->stats).nonfull_slabs;
      *psVar1 = *psVar1 - 1;
    }
    arena_dalloc_bin_slab(tsdn,arena,slab,bin);
  }
  else if ((uVar5 == 1) && (bin->slabcur != slab)) {
    bin_00 = (bin_t *)(ulong)manual_arena_base;
    if (manual_arena_base <= arena->base->ind) {
      peVar7 = (bin->slabs_full).qlh_first;
      if (peVar7 == slab) {
        peVar7 = (peVar7->ql_link).qre_next;
        (bin->slabs_full).qlh_first = peVar7;
      }
      if (peVar7 == slab) {
        (bin->slabs_full).qlh_first = (extent_t *)0x0;
      }
      else {
        peVar7 = (slab->ql_link).qre_next;
        bin_00 = (bin_t *)(slab->ql_link).qre_prev;
        (bin_00->lock).field_0.witness.opaque = peVar7;
        (peVar7->ql_link).qre_prev = (extent_t *)bin_00;
        (slab->ql_link).qre_next = slab;
        (slab->ql_link).qre_prev = slab;
      }
    }
    arena_bin_lower_slab((tsdn_t *)arena,(arena_t *)slab,(extent_t *)bin,bin_00);
  }
  puVar2 = &(bin->stats).ndalloc;
  *puVar2 = *puVar2 + 1;
  psVar1 = &(bin->stats).curregs;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

static void
arena_dalloc_bin_locked_impl(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind, extent_t *slab, void *ptr, bool junked) {
	arena_slab_data_t *slab_data = extent_slab_data_get(slab);
	const bin_info_t *bin_info = &bin_infos[binind];

	if (!junked && config_fill && unlikely(opt_junk_free)) {
		arena_dalloc_junk_small(ptr, bin_info);
	}

	arena_slab_reg_dalloc(slab, slab_data, ptr);
	unsigned nfree = extent_nfree_get(slab);
	if (nfree == bin_info->nregs) {
		arena_dissociate_bin_slab(arena, slab, bin);
		arena_dalloc_bin_slab(tsdn, arena, slab, bin);
	} else if (nfree == 1 && slab != bin->slabcur) {
		arena_bin_slabs_full_remove(arena, bin, slab);
		arena_bin_lower_slab(tsdn, arena, slab, bin);
	}

	if (config_stats) {
		bin->stats.ndalloc++;
		bin->stats.curregs--;
	}
}